

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O1

void __thiscall
leveldb::FaultInjectionTest::NoWriteTestReopenWithFault
          (FaultInjectionTest *this,ResetMethod reset_method)

{
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [24];
  stringstream local_198 [392];
  
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  this->db_ = (DB *)0x0;
  ResetDBState(this,reset_method);
  local_1b0[0] = true;
  local_1b0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/fault_injection_test.cc"
  ;
  local_1b0._16_4_ = 0x1fe;
  std::__cxx11::stringstream::stringstream(local_198);
  OpenDB((FaultInjectionTest *)local_1b8);
  test::Tester::IsOk((Tester *)local_1b0,(Status *)local_1b8);
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_1b8);
  }
  test::Tester::~Tester((Tester *)local_1b0);
  return;
}

Assistant:

void NoWriteTestReopenWithFault(ResetMethod reset_method) {
    CloseDB();
    ResetDBState(reset_method);
    ASSERT_OK(OpenDB());
  }